

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int stbtt__matchpair(stbtt_uint8 *fc,stbtt_uint32 nm,stbtt_uint8 *name,stbtt_int32 nlen,
                    stbtt_int32 target_id,stbtt_int32 next_id)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  stbtt_int32 sVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  ushort uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar5 = *(ushort *)(fc + (ulong)nm + 2) << 8 | *(ushort *)(fc + (ulong)nm + 2) >> 8;
  if (uVar5 != 0) {
    iVar2 = (ushort)(*(ushort *)(fc + (ulong)nm + 4) << 8 | *(ushort *)(fc + (ulong)nm + 4) >> 8) +
            nm;
    uVar7 = nm + 6;
    uVar9 = 1;
    do {
      if ((uint)(ushort)(*(ushort *)(fc + (ulong)uVar7 + 6) << 8 |
                        *(ushort *)(fc + (ulong)uVar7 + 6) >> 8) == target_id) {
        uVar6 = *(ushort *)(fc + uVar7) << 8 | *(ushort *)(fc + uVar7) >> 8;
        uVar8 = *(ushort *)(fc + (ulong)uVar7 + 2) << 8 | *(ushort *)(fc + (ulong)uVar7 + 2) >> 8;
        uVar1 = *(ushort *)(fc + (ulong)uVar7 + 4);
        if (uVar6 != 0) {
          if ((uVar6 != 3) || (uVar8 != 1 && uVar8 != 10)) goto LAB_0012d601;
        }
        uVar3 = stbtt__CompareUTF8toUTF16_bigendian_prefix
                          (name,nlen,
                           fc + (ulong)(ushort)(*(ushort *)(fc + (ulong)uVar7 + 10) << 8 |
                                               *(ushort *)(fc + (ulong)uVar7 + 10) >> 8) +
                                (long)iVar2,
                           (uint)(ushort)(*(ushort *)(fc + (ulong)uVar7 + 8) << 8 |
                                         *(ushort *)(fc + (ulong)uVar7 + 8) >> 8));
        if (-1 < (int)uVar3) {
          if (((((uVar9 < uVar5) &&
                ((uint)(ushort)(*(ushort *)(fc + (ulong)uVar7 + 0x12) << 8 |
                               *(ushort *)(fc + (ulong)uVar7 + 0x12) >> 8) == next_id)) &&
               ((ushort)(*(ushort *)(fc + (ulong)uVar7 + 0xc) << 8 |
                        *(ushort *)(fc + (ulong)uVar7 + 0xc) >> 8) == uVar6)) &&
              (((ushort)(*(ushort *)(fc + (ulong)uVar7 + 0xe) << 8 |
                        *(ushort *)(fc + (ulong)uVar7 + 0xe) >> 8) == uVar8 &&
               ((ushort)(*(ushort *)(fc + (ulong)uVar7 + 0x10) << 8 |
                        *(ushort *)(fc + (ulong)uVar7 + 0x10) >> 8) ==
                (ushort)(uVar1 << 8 | uVar1 >> 8))))) &&
             (uVar1 = *(ushort *)(fc + (ulong)uVar7 + 0x14) << 8 |
                      *(ushort *)(fc + (ulong)uVar7 + 0x14) >> 8, uVar1 != 0)) {
            if ((((int)uVar3 < nlen) && (name[uVar3] == ' ')) &&
               (sVar4 = stbtt__CompareUTF8toUTF16_bigendian_prefix
                                  (name + (ulong)uVar3 + 1,~uVar3 + nlen,
                                   fc + (ulong)(ushort)(*(ushort *)(fc + (ulong)uVar7 + 0x16) << 8 |
                                                       *(ushort *)(fc + (ulong)uVar7 + 0x16) >> 8) +
                                        (long)iVar2,(uint)uVar1), sVar4 == ~uVar3 + nlen)) {
              return 1;
            }
          }
          else if (uVar3 == nlen) {
            return 1;
          }
        }
      }
LAB_0012d601:
      uVar7 = uVar7 + 0xc;
      bVar10 = uVar9 != uVar5;
      uVar9 = uVar9 + 1;
    } while (bVar10);
  }
  return 0;
}

Assistant:

static int stbtt__matchpair(stbtt_uint8 *fc, stbtt_uint32 nm, stbtt_uint8 *name, stbtt_int32 nlen, stbtt_int32 target_id, stbtt_int32 next_id)
{
stbtt_int32 i;
stbtt_int32 count = ttUSHORT(fc+nm+2);
stbtt_int32 stringOffset = nm + ttUSHORT(fc+nm+4);

for (i=0; i < count; ++i) {
stbtt_uint32 loc = nm + 6 + 12 * i;
stbtt_int32 id = ttUSHORT(fc+loc+6);
if (id == target_id) {
/*  find the encoding */
stbtt_int32 platform = ttUSHORT(fc+loc+0), encoding = ttUSHORT(fc+loc+2), language = ttUSHORT(fc+loc+4);

/*  is this a Unicode encoding? */
if (platform == 0 || (platform == 3 && encoding == 1) || (platform == 3 && encoding == 10)) {
stbtt_int32 slen = ttUSHORT(fc+loc+8);
stbtt_int32 off = ttUSHORT(fc+loc+10);

/*  check if there's a prefix match */
stbtt_int32 matchlen = stbtt__CompareUTF8toUTF16_bigendian_prefix(name, nlen, fc+stringOffset+off,slen);
if (matchlen >= 0) {
/*  check for target_id+1 immediately following, with same encoding & language */
if (i+1 < count && ttUSHORT(fc+loc+12+6) == next_id && ttUSHORT(fc+loc+12) == platform && ttUSHORT(fc+loc+12+2) == encoding && ttUSHORT(fc+loc+12+4) == language) {
slen = ttUSHORT(fc+loc+12+8);
off = ttUSHORT(fc+loc+12+10);
if (slen == 0) {
if (matchlen == nlen)
return 1;
} else if (matchlen < nlen && name[matchlen] == ' ') {
++matchlen;
if (stbtt_CompareUTF8toUTF16_bigendian_internal((char*) (name+matchlen), nlen-matchlen, (char*)(fc+stringOffset+off),slen))
return 1;
}
} else {
/*  if nothing immediately following */
if (matchlen == nlen)
return 1;
}
}
}

/*  @TODO handle other encodings */
}
}
return 0;
}